

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

Task * AI::create_Wait(Task *__return_storage_ptr__,float time)

{
  void *pvVar1;
  string local_68;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  _Any_data __tmp;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"wait",(allocator<char> *)local_48._M_pod_data);
  Task::Task(__return_storage_ptr__,&local_68,Simple);
  std::__cxx11::string::~string((string *)&local_68);
  __return_storage_ptr__->action = Wait;
  std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::resize
            (&(__return_storage_ptr__->parameters).vectors,1);
  local_48._4_4_ = 0;
  local_48._0_4_ = time;
  __tmp._M_unused._M_object = local_48._M_unused._M_object;
  __tmp._8_8_ = 0;
  pvVar1 = *(void **)&(__return_storage_ptr__->setup).super__Function_base._M_functor;
  local_48._8_8_ =
       *(undefined8 *)((long)&(__return_storage_ptr__->setup).super__Function_base._M_functor + 8);
  *(void **)&(__return_storage_ptr__->setup).super__Function_base._M_functor =
       local_48._M_unused._M_object;
  *(undefined8 *)((long)&(__return_storage_ptr__->setup).super__Function_base._M_functor + 8) = 0;
  local_38 = (__return_storage_ptr__->setup).super__Function_base._M_manager;
  p_Stack_30 = (__return_storage_ptr__->setup)._M_invoker;
  (__return_storage_ptr__->setup).super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:55:16)>
       ::_M_manager;
  (__return_storage_ptr__->setup)._M_invoker =
       std::
       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:55:16)>
       ::_M_invoke;
  local_48._M_unused._M_object = pvVar1;
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  local_48._M_unused._M_member_pointer = 3;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>
            (&(__return_storage_ptr__->postconditions).satisfiedPredicates,
             (SatisfiablePredicateParams *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

Task create_Wait(float time)
	{
		Task wait {"wait"};		
		wait.action = Action::Wait;
		wait.parameters.vectors.resize(1);
		wait.setup = [=](Task& task, const WorldState& state, const WorldQuerier&)
		{
			//parameters.vectors[0] is {current alarm time, total alarm time, UNUSED}
			task.parameters.vectors[0].x = 0;
			task.parameters.vectors[0].y = time;
		};
		
		wait.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::TimeElapsed, 0});

		return wait;
	}